

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.cc
# Opt level: O1

Status __thiscall leveldb::BlockHandle::DecodeFrom(BlockHandle *this,Slice *input)

{
  bool bVar1;
  Slice *in_RDX;
  long in_FS_OFFSET;
  Slice local_40;
  Slice local_30;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  bVar1 = GetVarint64(in_RDX,(uint64_t *)input);
  if (bVar1) {
    bVar1 = GetVarint64(in_RDX,&input->size_);
    if (bVar1) {
      this->offset_ = 0;
      goto LAB_00d2e90b;
    }
  }
  local_30.data_ = "bad block handle";
  local_30.size_ = 0x10;
  local_40.data_ = "";
  local_40.size_ = 0;
  Status::Status((Status *)this,kCorruption,&local_30,&local_40);
LAB_00d2e90b:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return (Status)(char *)this;
  }
  __stack_chk_fail();
}

Assistant:

Status BlockHandle::DecodeFrom(Slice* input) {
  if (GetVarint64(input, &offset_) && GetVarint64(input, &size_)) {
    return Status::OK();
  } else {
    return Status::Corruption("bad block handle");
  }
}